

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialassetid.cpp
# Opt level: O2

void __thiscall
ConfidentialAssetId_GetCommitment_Test::TestBody(ConfidentialAssetId_GetCommitment_Test *this)

{
  char *message;
  AssertHelper local_b0;
  AssertionResult gtest_ar;
  ConfidentialAssetId commitment;
  string local_70;
  BlindFactor abf;
  ConfidentialAssetId asset;
  
  std::__cxx11::string::string
            ((string *)&commitment,
             "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3",(allocator *)&abf);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&asset,(string *)&commitment);
  std::__cxx11::string::~string((string *)&commitment);
  std::__cxx11::string::string
            ((string *)&commitment,
             "346dbdba35c19f6e3958a2c00881024503f6611d23d98d270b98ef9de3edc7a3",
             (allocator *)&local_70);
  cfd::core::BlindFactor::BlindFactor(&abf,(string *)&commitment);
  std::__cxx11::string::~string((string *)&commitment);
  cfd::core::ConfidentialAssetId::GetCommitment(&commitment,&asset,&abf);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_70,&commitment);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"commitment.GetHex().c_str()",
             "\"0a533b742a568c0b5285bf5bdfe9623a78082d19fac9be1678f7c3adbb48b34d29\"",
             local_70._M_dataplus._M_p,
             "0a533b742a568c0b5285bf5bdfe9623a78082d19fac9be1678f7c3adbb48b34d29");
  std::__cxx11::string::~string((string *)&local_70);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialassetid.cpp"
               ,0x7b,message);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&commitment);
  cfd::core::BlindFactor::~BlindFactor(&abf);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&asset);
  return;
}

Assistant:

TEST(ConfidentialAssetId, GetCommitment) {
  ConfidentialAssetId asset(
      "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  BlindFactor abf(
      "346dbdba35c19f6e3958a2c00881024503f6611d23d98d270b98ef9de3edc7a3");
  ConfidentialAssetId commitment = ConfidentialAssetId::GetCommitment(
      asset, abf);
  EXPECT_STREQ(
      commitment.GetHex().c_str(),
      "0a533b742a568c0b5285bf5bdfe9623a78082d19fac9be1678f7c3adbb48b34d29");
}